

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O2

int Rsb_DecInitCexes(int nVars,word *f,word **g,int nGs,int nGsAll,word *pCexes,Vec_Int_t *vTries)

{
  word wVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  word *pwVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int local_64;
  int local_60;
  int local_5c;
  
  bVar2 = (char)nVars - 6U & 0x1f;
  uVar10 = 1 << bVar2;
  uVar9 = (ulong)uVar10;
  if (nVars < 7) {
    uVar9 = 1;
  }
  uVar11 = *f;
  iVar7 = (int)uVar9 * 0x40;
  local_60 = iVar7 + -1;
  wVar1 = f[local_60 >> 6];
  local_5c = 0;
  if ((uVar11 & 1) == 0) {
    lVar6 = 0;
    uVar3 = 0;
    if (0 < 1 << bVar2) {
      uVar3 = uVar10;
    }
    uVar4 = (ulong)uVar3;
    if (nVars < 7) {
      uVar4 = 1;
    }
    local_5c = -1;
    pwVar5 = f;
    for (; uVar4 * 0x40 + lVar6 != 0; lVar6 = lVar6 + -0x40) {
      if (*pwVar5 != 0) {
        local_5c = Abc_Tt6FirstBit(*pwVar5);
        local_5c = local_5c - (int)lVar6;
        break;
      }
      pwVar5 = pwVar5 + 1;
    }
  }
  local_64 = local_60;
  if (-1 < (long)wVar1) {
    local_64 = -1;
    uVar4 = uVar9;
    do {
      if ((int)uVar4 < 1) goto LAB_00471e08;
      lVar6 = uVar4 - 1;
      uVar4 = uVar4 - 1;
      iVar7 = iVar7 + -0x40;
    } while (f[lVar6] == 0);
    local_64 = Abc_Tt6LastBit(f[lVar6]);
    local_64 = local_64 + iVar7;
  }
LAB_00471e08:
  iVar7 = 0;
  if ((uVar11 & 1) != 0) {
    iVar7 = -1;
    uVar4 = 0;
    uVar11 = (ulong)uVar10;
    if (1 << bVar2 < 1) {
      uVar11 = uVar4;
    }
    if (nVars < 7) {
      uVar11 = 1;
    }
    pwVar5 = f;
    for (; uVar11 * 0x40 + uVar4 != 0; uVar4 = uVar4 - 0x40) {
      if (*pwVar5 != 0xffffffffffffffff) {
        iVar7 = Abc_Tt6FirstBit(~*pwVar5);
        iVar7 = iVar7 - (int)uVar4;
        break;
      }
      pwVar5 = pwVar5 + 1;
    }
  }
  if ((long)wVar1 < 0) {
    iVar8 = (int)uVar9 << 6;
    local_60 = -1;
    do {
      if ((int)uVar9 < 1) goto LAB_00471e99;
      lVar6 = uVar9 - 1;
      uVar9 = uVar9 - 1;
      iVar8 = iVar8 + -0x40;
    } while (f[lVar6] == 0xffffffffffffffff);
    local_60 = Abc_Tt6LastBit(~f[lVar6]);
    local_60 = local_60 + iVar8;
  }
LAB_00471e99:
  iVar8 = Rsb_DecTryCex(f,local_5c,iVar7);
  if (iVar8 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x131,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar8 = Rsb_DecTryCex(f,local_5c,local_60);
  if (iVar8 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF1 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x132,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar8 = Rsb_DecTryCex(f,local_64,iVar7);
  if (iVar8 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x133,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar8 = Rsb_DecTryCex(f,local_64,local_60);
  if (iVar8 != 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF1 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x134,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  Rsb_DecRecordCex(g,nGsAll,local_5c,iVar7,pCexes,0);
  Rsb_DecRecordCex(g,nGsAll,local_5c,local_60,pCexes,1);
  Rsb_DecRecordCex(g,nGsAll,local_64,iVar7,pCexes,2);
  Rsb_DecRecordCex(g,nGsAll,local_64,local_60,pCexes,3);
  if (vTries != (Vec_Int_t *)0x0) {
    Vec_IntPush(vTries,-1);
    Vec_IntPush(vTries,-1);
    Vec_IntPush(vTries,-1);
    Vec_IntPush(vTries,-1);
  }
  return 4;
}

Assistant:

int Rsb_DecInitCexes( int nVars, word * f, word ** g, int nGs, int nGsAll, word * pCexes, Vec_Int_t * vTries ) 
{
    int nWords = Abc_TtWordNum( nVars );
    int ValueB = Abc_TtGetBit( f, 0 );
    int ValueE = Abc_TtGetBit( f, 64*nWords-1 );
    int iCexT0, iCexT1, iCexF0, iCexF1;

    iCexT0 = ValueB  ? 0           : Abc_TtFindFirstBit( f, nVars );
    iCexT1 = ValueE  ? 64*nWords-1 : Abc_TtFindLastBit( f, nVars );

    iCexF0 = !ValueB ? 0           : Abc_TtFindFirstZero( f, nVars );
    iCexF1 = !ValueE ? 64*nWords-1 : Abc_TtFindLastZero( f, nVars );

    assert( !Rsb_DecTryCex( f, iCexT0, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT0, iCexF1 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF1 ) );

    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF0, pCexes, 0 );
    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF1, pCexes, 1 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF0, pCexes, 2 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF1, pCexes, 3 );

    if ( vTries )
    {
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    }
    return 4;
}